

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

int32_t __thiscall
wasm::Match::Internal::GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0>
::operator()(GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0> *this,
            Literal *lit)

{
  int32_t iVar1;
  Literal local_30;
  Literal *local_18;
  Literal *lit_local;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::I32LK>,_0> *this_local;
  
  local_18 = lit;
  lit_local = (Literal *)this;
  wasm::Literal::Literal(&local_30,lit);
  iVar1 = I32LK::getVal(&local_30);
  wasm::Literal::~Literal(&local_30);
  return iVar1;
}

Assistant:

decltype(auto) operator()(Literal lit) { return T::getVal(lit); }